

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O1

bool __thiscall TokenScanner::hasMoreTokens(TokenScanner *this)

{
  int iVar1;
  StringCell *pSVar2;
  string token;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  nextToken_abi_cxx11_(&local_38,this);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  pSVar2 = (StringCell *)operator_new(0x28);
  (pSVar2->str)._M_dataplus._M_p = (pointer)&(pSVar2->str).field_2;
  (pSVar2->str)._M_string_length = 0;
  (pSVar2->str).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)pSVar2);
  pSVar2->link = this->savedTokens;
  this->savedTokens = pSVar2;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return iVar1 != 0;
}

Assistant:

bool TokenScanner::hasMoreTokens() {
   string token = nextToken();
   saveToken(token);
   return (token != "");
}